

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Secp256k1::CombinePubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *pubkey_list)

{
  allocator<secp256k1_pubkey> *this_00;
  ulong uVar1;
  CfdError error_code;
  undefined8 uVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  uchar *puVar6;
  reference ppaVar7;
  anon_struct_64_1_898a9ca8 **pubnonces;
  string *in_stack_fffffffffffffcd0;
  secp256k1_context *psVar8;
  undefined4 in_stack_fffffffffffffcd8;
  CfdError in_stack_fffffffffffffcdc;
  CfdException *in_stack_fffffffffffffce0;
  CfdException *this_01;
  allocator local_251;
  string local_250 [32];
  CfdSourceLocation local_230;
  size_type local_218;
  size_t byte_size;
  undefined1 local_208 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  string local_1e8 [32];
  CfdSourceLocation local_1c8;
  undefined1 local_1aa [8];
  secp256k1_pubkey combine_key;
  CfdSourceLocation local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  ulong local_100;
  size_t i;
  int ret;
  vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_> ptr_array;
  undefined1 local_d0 [8];
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> key_array;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  secp256k1_context *local_28;
  secp256k1_context *context;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *pubkey_list_local;
  Secp256k1 *this_local;
  
  local_28 = (secp256k1_context *)this->secp256k1_context_;
  context = (secp256k1_context *)pubkey_list;
  pubkey_list_local = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this;
  this_local = (Secp256k1 *)__return_storage_ptr__;
  if (this->secp256k1_context_ == (void *)0x0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x38;
    local_40.funcname = "CombinePubkeySecp256k1Ec";
    logger::warn<>(&local_40,"Secp256k1 context is NULL.");
    local_75 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_60,"Secp256k1 context is NULL.",&local_61);
    CfdException::CfdException
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd0);
    local_75 = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    (pubkey_list);
  if (sVar3 < 2) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x3e;
    local_90.funcname = "CombinePubkeySecp256k1Ec";
    logger::warn<>(&local_90,"Invalid Argument pubkey list.");
    key_array.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_b0,"Invalid Pubkey List data.",
               (allocator *)
               ((long)&key_array.
                       super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd0);
    key_array.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context);
  this_00 = (allocator<secp256k1_pubkey> *)
            ((long)&ptr_array.
                    super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<secp256k1_pubkey>::allocator(this_00);
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_d0,sVar3,this_00);
  ::std::allocator<secp256k1_pubkey>::~allocator
            ((allocator<secp256k1_pubkey> *)
             ((long)&ptr_array.
                     super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context);
  ::std::allocator<secp256k1_pubkey_*>::allocator((allocator<secp256k1_pubkey_*> *)((long)&i + 7));
  ::std::vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>::vector
            ((vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_> *)&ret,sVar3,
             (allocator<secp256k1_pubkey_*> *)((long)&i + 7));
  ::std::allocator<secp256k1_pubkey_*>::~allocator((allocator<secp256k1_pubkey_*> *)((long)&i + 7));
  local_100 = 0;
  while( true ) {
    uVar1 = local_100;
    sVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                      ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context)
    ;
    psVar8 = local_28;
    if (sVar3 <= uVar1) break;
    pvVar4 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::operator[]
                       ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_d0,
                        local_100);
    pvVar5 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context
                        ,local_100);
    ByteData::GetBytes(&local_118,pvVar5);
    puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4855a0);
    pvVar5 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context
                        ,local_100);
    ByteData::GetBytes(&local_130,pvVar5);
    sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130);
    i._0_4_ = secp256k1_ec_pubkey_parse(psVar8,(secp256k1_pubkey_conflict *)pvVar4,puVar6,sVar3);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffcd0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffcd0);
    if ((CfdError)i != 1) {
      local_148.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                   ,0x2f);
      local_148.filename = local_148.filename + 1;
      local_148.line = 0x4e;
      local_148.funcname = "CombinePubkeySecp256k1Ec";
      logger::warn<>(&local_148,"Secp256k1 pubkey parse Error.");
      combine_key.data[0x38] = '\x01';
      uVar2 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(combine_key.data + 0x3a),"Secp256k1 pubkey parse Error.",
                 (allocator *)(combine_key.data + 0x39));
      CfdException::CfdException
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd0);
      combine_key.data[0x38] = '\0';
      __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pvVar4 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::operator[]
                       ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_d0,
                        local_100);
    ppaVar7 = ::std::vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>::operator[]
                        ((vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_> *)&ret,
                         local_100);
    *ppaVar7 = pvVar4;
    local_100 = local_100 + 1;
  }
  pubnonces = ::std::vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>::data
                        ((vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_> *)&ret);
  sVar3 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::size
                    ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_d0);
  i._0_4_ = secp256k1_ec_pubkey_combine
                      (psVar8,(secp256k1_pubkey_conflict *)local_1aa,
                       (secp256k1_pubkey_conflict **)pubnonces,sVar3);
  if ((CfdError)i != 1) {
    local_1c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_1c8.filename = local_1c8.filename + 1;
    local_1c8.line = 0x5a;
    local_1c8.funcname = "CombinePubkeySecp256k1Ec";
    logger::warn<>(&local_1c8,"Secp256k1 pubkey combine Error.");
    byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1e8,"Secp256k1 pubkey combine Error.",
               (allocator *)
               ((long)&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd0);
    byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this_01 = (CfdException *)((long)&byte_size + 7);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4859af);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (allocator_type *)in_stack_fffffffffffffcd0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4859d5);
  local_218 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
  psVar8 = local_28;
  puVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x485a06);
  error_code = secp256k1_ec_pubkey_serialize
                         (psVar8,puVar6,&local_218,(secp256k1_pubkey_conflict *)local_1aa,0x102);
  i._0_4_ = error_code;
  if (error_code != kCfdIllegalArgumentError) {
    local_230.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_230.filename = local_230.filename + 1;
    local_230.line = 0x67;
    local_230.funcname = "CombinePubkeySecp256k1Ec";
    logger::warn<>(&local_230,"Secp256k1 pubkey serialize Error.");
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_250,"Secp256k1 pubkey serialize Error.",&local_251);
    CfdException::CfdException(this_01,error_code,(string *)psVar8);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,
             CONCAT44(1,in_stack_fffffffffffffcd8));
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)psVar8);
  ::std::vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>::~vector
            ((vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_> *)&ret);
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::~vector
            ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

ByteData Secp256k1::CombinePubkeySecp256k1Ec(
    const std::vector<ByteData>& pubkey_list) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }

  if (pubkey_list.size() < 2) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey List data.");
  }

  std::vector<secp256k1_pubkey> key_array(pubkey_list.size());
  std::vector<secp256k1_pubkey*> ptr_array(pubkey_list.size());
  int ret;

  for (size_t i = 0; i < pubkey_list.size(); ++i) {
    // Change ByteData to secp256k1_pubkey format
    ret = secp256k1_ec_pubkey_parse(
        context, &key_array[i], pubkey_list[i].GetBytes().data(),
        pubkey_list[i].GetBytes().size());

    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "Secp256k1 pubkey parse Error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
    }
    ptr_array[i] = &key_array[i];
  }

  // Join Pubkey
  secp256k1_pubkey combine_key;
  ret = secp256k1_ec_pubkey_combine(
      context, &combine_key, ptr_array.data(), key_array.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey combine Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey combine Error.");
  }

  std::vector<uint8_t> byte_data(65);
  size_t byte_size = byte_data.size();
  // Format ByteData
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &combine_key,
      SECP256K1_EC_COMPRESSED);

  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey serialize Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  byte_data.resize(byte_size);
  return ByteData(byte_data);
}